

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextVoid(char *str_id,ImGuiMouseButton mouse_button)

{
  bool bVar1;
  ImGuiID flags;
  ImGuiMouseButton in_ESI;
  char *unaff_retaddr;
  ImGuiID id;
  ImGuiWindowFlags in_stack_0000001c;
  ImGuiID in_stack_00000020;
  ImGuiID in_stack_00000044;
  
  flags = ImGuiWindow::GetID((ImGuiWindow *)str_id,(char *)CONCAT44(mouse_button,id),unaff_retaddr);
  bVar1 = IsMouseReleased(in_ESI);
  if ((bVar1) && (bVar1 = IsWindowHovered(flags), !bVar1)) {
    OpenPopupEx(in_stack_00000044);
  }
  bVar1 = BeginPopupEx(in_stack_00000020,in_stack_0000001c);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextVoid(const char* str_id, ImGuiMouseButton mouse_button)
{
    if (!str_id)
        str_id = "void_context";
    ImGuiID id = GImGui->CurrentWindow->GetID(str_id);
    if (IsMouseReleased(mouse_button) && !IsWindowHovered(ImGuiHoveredFlags_AnyWindow))
        OpenPopupEx(id);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoSavedSettings);
}